

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> __thiscall
wabt::interp::TagType::Clone(TagType *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  
  pp_Var1 = (_func_int **)operator_new(0x28);
  *pp_Var1 = (_func_int *)&PTR__ExternType_0022c560;
  *(undefined4 *)(pp_Var1 + 1) = *(undefined4 *)(in_RSI + 8);
  *pp_Var1 = (_func_int *)&PTR__TagType_0022c990;
  *(undefined4 *)((long)pp_Var1 + 0xc) = *(undefined4 *)(in_RSI + 0xc);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pp_Var1 + 2),
             (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(in_RSI + 0x10));
  (this->super_ExternType)._vptr_ExternType = pp_Var1;
  return (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExternType> TagType::Clone() const {
  return std::make_unique<TagType>(*this);
}